

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

void d68020_divl(void)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char *__format;
  uint in_EDI;
  uint uVar4;
  
  if (((byte)g_cpu_type & 0x1c) == 0) {
    if ((~g_cpu_ir & 0xf000) == 0) {
      pcVar2 = "dc.w    $%04x; opcode 1111";
    }
    else {
      pcVar2 = "dc.w $%04x; ILLEGAL";
    }
    sprintf(g_dasm_str,pcVar2);
    return;
  }
  uVar1 = dasm_read_imm_16(in_EDI);
  if ((uVar1 >> 10 & 1) == 0) {
    uVar4 = uVar1 >> 0xc & 7;
    pcVar2 = get_ea_mode_str(g_cpu_ir,2);
    uVar3 = (ulong)((uint)((uVar1 >> 0xb & 1) == 0) * 2 + 0x73);
    if ((uVar1 & 7) == uVar4) {
      sprintf(g_dasm_str,"div%c.l  %s, D%d; (2+)",uVar3,pcVar2,(ulong)(uVar1 & 7));
      return;
    }
    __format = "div%cl.l %s, D%d:D%d; (2+)";
  }
  else {
    pcVar2 = get_ea_mode_str(g_cpu_ir,2);
    uVar4 = uVar1 >> 0xc & 7;
    __format = "div%c.l  %s, D%d:D%d; (2+)";
    uVar3 = (ulong)((uint)((uVar1 >> 0xb & 1) == 0) * 2 + 0x73);
  }
  sprintf(g_dasm_str,__format,uVar3,pcVar2,(ulong)(uVar1 & 7),(ulong)uVar4);
  return;
}

Assistant:

static void d68020_divl(void)
{
	uint extension;
	LIMIT_CPU_TYPES(M68020_PLUS);
	extension = read_imm_16();

	if(BIT_A(extension))
		sprintf(g_dasm_str, "div%c.l  %s, D%d:D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), extension&7, (extension>>12)&7);
	else if((extension&7) == ((extension>>12)&7))
		sprintf(g_dasm_str, "div%c.l  %s, D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), (extension>>12)&7);
	else
		sprintf(g_dasm_str, "div%cl.l %s, D%d:D%d; (2+)", BIT_B(extension) ? 's' : 'u', get_ea_mode_str_32(g_cpu_ir), extension&7, (extension>>12)&7);
}